

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O0

void __thiscall
linkedList<myString>::linkedList(linkedList<myString> *this,linkedList<myString> *rhs)

{
  bool bVar1;
  myString *right;
  myString local_80;
  undefined1 local_68 [8];
  myString item;
  undefined1 local_40 [8];
  Iterator __end0;
  Iterator __begin0;
  linkedList<myString> *__range1;
  linkedList<myString> *rhs_local;
  linkedList<myString> *this_local;
  
  this->_vptr_linkedList = (_func_int **)&PTR__linkedList_0011b920;
  this->size = 0;
  this->head = (l_node<myString> *)0x0;
  this->tail = (l_node<myString> *)0x0;
  begin((linkedList<myString> *)&__end0.currPtr);
  end((linkedList<myString> *)local_40);
  while( true ) {
    bVar1 = Iterator::operator!=((Iterator *)&__end0.currPtr,(Iterator *)local_40);
    if (!bVar1) break;
    right = Iterator::operator*((Iterator *)&__end0.currPtr);
    myString::myString((myString *)local_68,right);
    myString::myString(&local_80,(myString *)local_68);
    insert_last(this,&local_80);
    myString::~myString(&local_80);
    myString::~myString((myString *)local_68);
    Iterator::operator++((Iterator *)&__end0.currPtr);
  }
  Iterator::~Iterator((Iterator *)local_40);
  Iterator::~Iterator((Iterator *)&__end0.currPtr);
  return;
}

Assistant:

linkedList<T>::linkedList(linkedList &rhs) {



//    this->clear(); // the function at the start of this review
    this->head = nullptr;
    this->tail= nullptr;

    for ( auto item : rhs) {
        this->insert_last(item);

    }


}